

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::PreAttribute(cmXMLWriter *this)

{
  cmXMLWriter *this_local;
  
  if ((this->ElementOpen & 1U) != 0) {
    ConditionalLineBreak(this,(bool)(this->BreakAttrib & 1));
    if ((this->BreakAttrib & 1U) == 0) {
      std::operator<<(this->Output,' ');
    }
    return;
  }
  __assert_fail("this->ElementOpen",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmXMLWriter.cxx"
                ,0x7c,"void cmXMLWriter::PreAttribute()");
}

Assistant:

void cmXMLWriter::PreAttribute()
{
  assert(this->ElementOpen);
  this->ConditionalLineBreak(this->BreakAttrib);
  if (!this->BreakAttrib) {
    this->Output << ' ';
  }
}